

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderStairs<ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLogLin>
               (GetterXsYs<long_long> *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImPlotPlot *pIVar3;
  long lVar4;
  float fVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  ImDrawList *this;
  long lVar8;
  int iVar9;
  int iVar10;
  ImPlotContext *gp;
  double dVar11;
  float fVar12;
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_78;
  ImVec2 local_70;
  ImDrawList *local_68;
  TransformerLogLin *local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar6 = GImPlot;
  pIVar3 = GImPlot->CurrentPlot;
  local_68 = DrawList;
  if (((pIVar3->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar9 = getter->Count;
    local_48 = iVar9 + -1;
    local_40 = line_weight * 0.5;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    lVar8 = (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
    lVar4 = *(long *)((long)getter->Ys + lVar8);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar11 = log10((double)*(long *)((long)getter->Xs + lVar8) / (pIVar3->XAxis).Range.Min);
    pIVar3 = pIVar6->CurrentPlot;
    dVar2 = (pIVar3->XAxis).Range.Min;
    iVar9 = transformer->YAxis;
    local_3c.x = (float)((((double)(float)(dVar11 / pIVar6->LogDenX) *
                           ((pIVar3->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar6->Mx +
                        (double)pIVar6->PixelRange[iVar9].Min.x);
    local_3c.y = (float)(((double)lVar4 - pIVar3->YAxis[iVar9].Range.Min) * pIVar6->My[iVar9] +
                        (double)pIVar6->PixelRange[iVar9].Min.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLogLin>>
              ((StairsRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLogLin> *)local_58,
               local_68,&pIVar3->PlotRect);
  }
  else {
    iVar9 = getter->Count;
    lVar8 = (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
    lVar4 = *(long *)((long)getter->Ys + lVar8);
    dVar11 = log10((double)*(long *)((long)getter->Xs + lVar8) / (pIVar3->XAxis).Range.Min);
    pIVar3 = pIVar6->CurrentPlot;
    dVar2 = (pIVar3->XAxis).Range.Min;
    iVar9 = transformer->YAxis;
    local_58._0_4_ =
         (undefined4)
         ((((double)(float)(dVar11 / pIVar6->LogDenX) * ((pIVar3->XAxis).Range.Max - dVar2) + dVar2)
          - dVar2) * pIVar6->Mx + (double)pIVar6->PixelRange[iVar9].Min.x);
    local_58._4_4_ =
         (float)(((double)lVar4 - pIVar3->YAxis[iVar9].Range.Min) * pIVar6->My[iVar9] +
                (double)pIVar6->PixelRange[iVar9].Min.y);
    iVar9 = getter->Count;
    if (1 < iVar9) {
      iVar10 = 1;
      local_60 = transformer;
      do {
        pIVar7 = GImPlot;
        lVar8 = (long)(((getter->Offset + iVar10) % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
        lVar4 = *(long *)((long)getter->Ys + lVar8);
        dVar11 = log10((double)*(long *)((long)getter->Xs + lVar8) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        this = local_68;
        pIVar3 = pIVar7->CurrentPlot;
        dVar2 = (pIVar3->XAxis).Range.Min;
        iVar9 = transformer->YAxis;
        local_78.x = (float)((((double)(float)(dVar11 / pIVar7->LogDenX) *
                               ((pIVar3->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar7->Mx +
                            (double)pIVar7->PixelRange[iVar9].Min.x);
        fVar12 = (float)(((double)lVar4 - pIVar3->YAxis[iVar9].Range.Min) * pIVar7->My[iVar9] +
                        (double)pIVar7->PixelRange[iVar9].Min.y);
        local_78.y = fVar12;
        pIVar3 = pIVar6->CurrentPlot;
        fVar5 = (float)local_58._4_4_;
        if (fVar12 <= (float)local_58._4_4_) {
          fVar5 = fVar12;
        }
        if ((fVar5 < (pIVar3->PlotRect).Max.y) &&
           (fVar5 = (float)(~-(uint)(fVar12 <= (float)local_58._4_4_) & (uint)fVar12 |
                           -(uint)(fVar12 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar3->PlotRect).Min.y, *pfVar1 <= fVar5 && fVar5 != *pfVar1)) {
          fVar5 = (float)local_58._0_4_;
          if (local_78.x <= (float)local_58._0_4_) {
            fVar5 = local_78.x;
          }
          if ((fVar5 < (pIVar3->PlotRect).Max.x) &&
             (fVar5 = (float)(~-(uint)(local_78.x <= (float)local_58._0_4_) & (uint)local_78.x |
                             local_58._0_4_ & -(uint)(local_78.x <= (float)local_58._0_4_)),
             (pIVar3->PlotRect).Min.x <= fVar5 && fVar5 != (pIVar3->PlotRect).Min.x)) {
            local_70.y = (float)local_58._4_4_;
            local_70.x = local_78.x;
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_70,col,line_weight);
            transformer = local_60;
            ImDrawList::AddLine(this,&local_70,&local_78,col,line_weight);
          }
        }
        local_58._0_4_ = local_78.x;
        local_58._4_4_ = local_78.y;
        iVar10 = iVar10 + 1;
        iVar9 = getter->Count;
      } while (iVar10 < iVar9);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}